

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O1

UBool uprv_isInvariantUString_63(UChar *s,int32_t length)

{
  UChar UVar1;
  
  do {
    if (length < 0) {
      UVar1 = *s;
      if (UVar1 == L'\0') {
        return '\x01';
      }
    }
    else {
      if (length == 0) {
        return '\x01';
      }
      length = length + -1;
      UVar1 = *s;
    }
  } while (((ushort)UVar1 < 0x80) &&
          (s = s + 1, (invariantChars[(ushort)UVar1 >> 5] >> ((ushort)UVar1 & 0x1f) & 1) != 0));
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
uprv_isInvariantUString(const UChar *s, int32_t length) {
    UChar c;

    for(;;) {
        if(length<0) {
            /* NUL-terminated */
            c=*s++;
            if(c==0) {
                break;
            }
        } else {
            /* count length */
            if(length==0) {
                break;
            }
            --length;
            c=*s++;
        }

        /*
         * no assertions here because these functions are legitimately called
         * for strings with variant characters
         */
        if(!UCHAR_IS_INVARIANT(c)) {
            return FALSE; /* found a variant char */
        }
    }
    return TRUE;
}